

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Infeas_Residuals(CUPDLPwork *work)

{
  cupdlp_float *in_RDI;
  CUPDLPwork *unaff_retaddr;
  cupdlp_float *in_stack_00000010;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  CUPDLPresobj *resobj;
  CUPDLPiterates *iterates;
  CUPDLPproblem *dDualInfeasRes;
  cupdlp_float *dPrimalInfeasObj;
  cupdlp_float *dualObj;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  cupdlp_float *dSlackNeg;
  CUPDLPwork *work_00;
  
  work_00 = (CUPDLPwork *)in_RDI[3];
  dSlackNeg = (cupdlp_float *)in_RDI[2];
  iVar1 = *(int *)in_RDI[6];
  dualObj = (&work_00->buffer2)[iVar1 % 2];
  dPrimalInfeasObj = (&work_00->rowScale)[iVar1 % 2];
  dDualInfeasRes = (&work_00[1].problem)[iVar1 % 2];
  PDHG_Compute_Primal_Infeasibility
            (unaff_retaddr,in_RDI,(cupdlp_float *)work_00,dSlackNeg,
             (cupdlp_float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(cupdlp_float)dualObj,
             dPrimalInfeasObj,in_stack_00000010);
  PDHG_Compute_Dual_Infeasibility
            (work_00,dSlackNeg,(cupdlp_float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             (cupdlp_float)dualObj,dPrimalInfeasObj,(cupdlp_float *)dDualInfeasRes);
  PDHG_Compute_Primal_Infeasibility
            (unaff_retaddr,in_RDI,(cupdlp_float *)work_00,dSlackNeg,
             (cupdlp_float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(cupdlp_float)dualObj,
             dPrimalInfeasObj,in_stack_00000010);
  PDHG_Compute_Dual_Infeasibility
            (work_00,dSlackNeg,(cupdlp_float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             (cupdlp_float)dualObj,dPrimalInfeasObj,(cupdlp_float *)dDualInfeasRes);
  return;
}

Assistant:

void PDHG_Compute_Infeas_Residuals(CUPDLPwork *work) {
#if problem_USE_TIMERS
  ++problem->nComputeResidualsCalls;
  double dStartTime = getTimeStamp();
#endif
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;


  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  // current solution
  PDHG_Compute_Primal_Infeasibility(work, y->data, resobj->dSlackPos,
                                    resobj->dSlackNeg, aty->data,
                                    resobj->dDualObj, &resobj->dPrimalInfeasObj,
                                    &resobj->dPrimalInfeasRes);
  PDHG_Compute_Dual_Infeasibility(work, x->data, ax->data,
                                  resobj->dPrimalObj, &resobj->dDualInfeasObj,
                                  &resobj->dDualInfeasRes);

  // average solution
  PDHG_Compute_Primal_Infeasibility(
      work, iterates->yAverage->data, resobj->dSlackPosAverage,
      resobj->dSlackNegAverage, iterates->atyAverage->data,
      resobj->dDualObjAverage, &resobj->dPrimalInfeasObjAverage,
      &resobj->dPrimalInfeasResAverage);
  PDHG_Compute_Dual_Infeasibility(
      work, iterates->xAverage->data, iterates->axAverage->data,
      resobj->dPrimalObjAverage, &resobj->dDualInfeasObjAverage,
      &resobj->dDualInfeasResAverage);

#if problem_USE_TIMERS
  problem->dComputeResidualsTime += getTimeStamp() - dStartTime;
#endif
}